

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::LoadConfigFiles(cmExportInstallFileGenerator *this,ostream *os)

{
  ostream *poVar1;
  string sStack_38;
  
  poVar1 = std::operator<<(os,"# Load information for each installed configuration.\n");
  poVar1 = std::operator<<(poVar1,
                           "get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n");
  poVar1 = std::operator<<(poVar1,"file(GLOB CONFIG_FILES \"${_DIR}/");
  GetConfigImportFileGlob_abi_cxx11_(&sStack_38,this);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  poVar1 = std::operator<<(poVar1,"\")\n");
  poVar1 = std::operator<<(poVar1,"foreach(f ${CONFIG_FILES})\n");
  poVar1 = std::operator<<(poVar1,"  include(${f})\n");
  poVar1 = std::operator<<(poVar1,"endforeach()\n");
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void cmExportInstallFileGenerator::LoadConfigFiles(std::ostream& os)
{
  // Now load per-configuration properties for them.
  /* clang-format off */
  os << "# Load information for each installed configuration.\n"
     << "get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n"
     << "file(GLOB CONFIG_FILES \"${_DIR}/"
     << this->GetConfigImportFileGlob() << "\")\n"
     << "foreach(f ${CONFIG_FILES})\n"
     << "  include(${f})\n"
     << "endforeach()\n"
     << "\n";
  /* clang-format on */
}